

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateMessageDefinitions
          (FileGenerator *this,Printer *p)

{
  ulong uVar1;
  size_t sVar2;
  size_type sVar3;
  reference pvVar4;
  reference this_00;
  pointer this_01;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  ulong local_20;
  size_t i;
  Printer *p_local;
  FileGenerator *this_local;
  
  local_20 = 0;
  i = (size_t)p;
  p_local = (Printer *)this;
  while( true ) {
    uVar1 = local_20;
    sVar3 = std::
            vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ::size(&this->message_generators_);
    sVar2 = i;
    if (sVar3 <= uVar1) break;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,"\n      $hrule_thin$\n    ");
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)sVar2,local_30._M_len,local_30._M_str);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->message_generators_topologically_ordered_,local_20);
    this_00 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ::operator[](&this->message_generators_,(long)*pvVar4);
    this_01 = std::
              unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
              ::operator->(this_00);
    MessageGenerator::GenerateClassDefinition(this_01,(Printer *)i);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void FileGenerator::GenerateMessageDefinitions(io::Printer* p) {
  for (size_t i = 0; i < message_generators_.size(); ++i) {
    p->Emit(R"cc(
      $hrule_thin$
    )cc");
    message_generators_[message_generators_topologically_ordered_[i]]
        ->GenerateClassDefinition(p);
  }
}